

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

natwm_error client_send_window_to_workspace(natwm_state *state,xcb_window_t window,size_t index)

{
  natwm_error nVar1;
  client *client;
  
  client = workspace_list_find_window_client(state->workspace_list,window);
  if (client != (client *)0x0) {
    nVar1 = workspace_list_send_to_workspace(state,client,index);
    return nVar1;
  }
  return NO_ERROR;
}

Assistant:

enum natwm_error client_send_window_to_workspace(struct natwm_state *state, xcb_window_t window,
                                                 size_t index)
{
        struct client *client = workspace_list_find_window_client(state->workspace_list, window);

        if (!client) {
                return NO_ERROR;
        }

        enum natwm_error err = workspace_list_send_to_workspace(state, client, index);

        if (err != NO_ERROR) {
                return err;
        }

        return NO_ERROR;
}